

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pool.hpp
# Opt level: O1

void __thiscall iutest::detail::iuPool::push(iuPool *this,value_ptr ptr)

{
  pointer *pppiVar1;
  iterator __position;
  value_ptr local_8;
  
  __position._M_current =
       (this->m_pool).
       super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_pool).
      super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = ptr;
    std::vector<iutest::detail::iuIObject*,std::allocator<iutest::detail::iuIObject*>>::
    _M_realloc_insert<iutest::detail::iuIObject*const&>
              ((vector<iutest::detail::iuIObject*,std::allocator<iutest::detail::iuIObject*>> *)this
               ,__position,&local_8);
  }
  else {
    *__position._M_current = ptr;
    pppiVar1 = &(this->m_pool).
                super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppiVar1 = *pppiVar1 + 1;
  }
  return;
}

Assistant:

void push(value_ptr ptr) { m_pool.push_back(ptr); }